

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void dw3_male_soldier(dw_rom *rom)

{
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1705,3,0,0x39,0);
  vpatch(rom,0x1a8b,3,0x36,0x15,3);
  vpatch(rom,0x12300,0x80,0xa6,0xac,0xb5,0x91,0x96,0x87,0x8f,0x83,7,0x8f,0x8f,0x8f,0xb,10,0x38,0x7c,
         100,0x34,0xac,0x88,0x68,0xe0,0xfe,0xd1,0xe0,0xf0,0xf0,0xf0,0xd0,0x50,0x10,0x2e,0xcb,0x70,9,
         0x8f,2,0x3c,0x3e,0x1e,0xbf,0x9f,0xcf,0x90,0x3d,0x3f,0x3f,0x1e,0xdb,0x15,0x97,0xf1,0x4e,0x20
         ,0x78,0,0xee,0xee,0xee,0xe,0xb0,0xdc,0xf8,0,0x66);
  vpatch(rom,0x12400,0x180,0x20,0x73,0x7d,0x7c,0x23,0x27,0x2f,0x23,3,0x57,0x7f,0x7f,0xe,2,0,0xc,0x20
         ,0xb0,0xf0,0xf0,0x70,0x78,0x70,0x88,0xd0,200,0x98,0xb8,0x98,0xfc,0xfc,0xf8,0x36,0x1b,0xf,
         0x23,0xe,4,0xe,0,0x2d,0x2c,0x3c,0x2c,0x11,0xb,0xf,0,0x40,0xe0,0xd0,0xf0,0x40,0x24,0x3c,0x78
         ,0xbc,0x18,0x70,8,0xbc,0xdc,0xbc,0x78,0x40);
  return;
}

Assistant:

static void dw3_male_soldier(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x36,  0x15,  0x03);
    vpatch(rom, 0x12300,  128,  0xa6,  0xac,  0xb5,  0x91,  0x96,  0x87,  0x8f,  0x83,  0x07,  0x8f,  0x8f,  0x8f,  0x0b,  0x0a,  0x38,  0x7c,  0x64,  0x34,  0xac,  0x88,  0x68,  0xe0,  0xfe,  0xd1,  0xe0,  0xf0,  0xf0,  0xf0,  0xd0,  0x50,  0x10,  0x2e,  0xcb,  0x70,  0x09,  0x8f,  0x02,  0x3c,  0x3e,  0x1e,  0xbf,  0x9f,  0xcf,  0x90,  0x3d,  0x3f,  0x3f,  0x1e,  0xdb,  0x15,  0x97,  0xf1,  0x4e,  0x20,  0x78,  0x00,  0xee,  0xee,  0xee,  0x0e,  0xb0,  0xdc,  0xf8,  0x00,  0x66,  0xec,  0xf5,  0xf1,  0x56,  0x47,  0x4f,  0x43,  0x07,  0xaf,  0xef,  0xef,  0x0b,  0x0a,  0x38,  0x3c,  0x64,  0x34,  0xac,  0x88,  0x68,  0xe0,  0xf3,  0xc4,  0xe0,  0xf0,  0xf0,  0xf0,  0xd0,  0x50,  0x1c,  0x3b,  0x4b,  0x30,  0x09,  0x4f,  0x02,  0x04,  0x1e,  0x00,  0x7f,  0xdf,  0xef,  0x50,  0x3d,  0x3b,  0x1f,  0x00,  0xde,  0x0d,  0x95,  0xe4,  0x43,  0x3c,  0x7c,  0x78,  0xf3,  0xfb,  0xf3,  0x13,  0xb8,  0xfc,  0xfc,  0x78);
    vpatch(rom, 0x12400,  384,  0x20,  0x73,  0x7d,  0x7c,  0x23,  0x27,  0x2f,  0x23,  0x03,  0x57,  0x7f,  0x7f,  0x0e,  0x02,  0x00,  0x0c,  0x20,  0xb0,  0xf0,  0xf0,  0x70,  0x78,  0x70,  0x88,  0xd0,  0xc8,  0x98,  0xb8,  0x98,  0xfc,  0xfc,  0xf8,  0x36,  0x1b,  0x0f,  0x23,  0x0e,  0x04,  0x0e,  0x00,  0x2d,  0x2c,  0x3c,  0x2c,  0x11,  0x0b,  0x0f,  0x00,  0x40,  0xe0,  0xd0,  0xf0,  0x40,  0x24,  0x3c,  0x78,  0xbc,  0x18,  0x70,  0x08,  0xbc,  0xdc,  0xbc,  0x78,  0x40,  0xe3,  0xed,  0xec,  0x43,  0x47,  0x47,  0x42,  0x03,  0xa7,  0xef,  0xef,  0x0e,  0x02,  0x00,  0x0d,  0x20,  0xb0,  0xf0,  0xf0,  0x70,  0x78,  0xf0,  0x28,  0xd0,  0xc8,  0x98,  0xb8,  0x98,  0xfc,  0x3c,  0xd8,  0x5b,  0x0a,  0x06,  0x46,  0x03,  0x04,  0x1e,  0x0f,  0x65,  0x75,  0x75,  0x49,  0x1c,  0x0b,  0x1d,  0x0f,  0x60,  0xa0,  0xf0,  0x30,  0xc0,  0x20,  0x38,  0x80,  0xdc,  0xd8,  0xd0,  0xc8,  0x3c,  0xd8,  0xb8,  0x80,  0x04,  0x0d,  0x0f,  0x0f,  0x0e,  0x1e,  0x0e,  0x11,  0x0b,  0x13,  0x19,  0x1d,  0x19,  0x3f,  0x3f,  0x1f,  0x04,  0xce,  0xbe,  0x3e,  0xc4,  0xe4,  0xe4,  0xc4,  0xc0,  0xea,  0xfe,  0xfe,  0x70,  0x40,  0x00,  0x00,  0x00,  0x07,  0x0b,  0x0f,  0x02,  0x24,  0x3c,  0x1e,  0x3f,  0x1f,  0x0f,  0x10,  0x3d,  0x3b,  0x3d,  0x1e,  0x44,  0xe0,  0xe0,  0xe4,  0x40,  0x20,  0x70,  0x00,  0xdc,  0x1c,  0x9c,  0x74,  0xb8,  0xd0,  0xf0,  0x00,  0x04,  0x0d,  0x0f,  0x0f,  0x0e,  0x1e,  0x0e,  0x11,  0x0b,  0x13,  0x19,  0x1d,  0x19,  0x3f,  0x3f,  0x1f,  0x10,  0xf8,  0xb8,  0x38,  0xd0,  0xf0,  0xf0,  0xd0,  0xc0,  0xe8,  0xf8,  0xf8,  0x60,  0x40,  0x00,  0x00,  0x00,  0x07,  0x0b,  0x0f,  0x02,  0x04,  0x1c,  0x01,  0x3f,  0x1e,  0x0e,  0x11,  0x3d,  0x1b,  0x1d,  0x01,  0x50,  0x80,  0x80,  0xb0,  0x40,  0x20,  0x78,  0xf0,  0xd0,  0x70,  0x70,  0x50,  0xb8,  0xd0,  0xb8,  0xf0,  0x26,  0x2e,  0x34,  0x10,  0x10,  0x00,  0x48,  0x83,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x0f,  0x3f,  0x7c,  0x65,  0x75,  0x2d,  0x09,  0x09,  0x01,  0x11,  0xc1,  0xe0,  0xf1,  0xf1,  0xf1,  0xf0,  0xf0,  0xfc,  0x3e,  0xcb,  0xb0,  0x99,  0xef,  0x42,  0x04,  0x3e,  0x1f,  0x3f,  0x5f,  0x6f,  0x10,  0x3d,  0x3b,  0x3f,  0x1f,  0xd3,  0x0e,  0x90,  0xf1,  0x40,  0x20,  0x78,  0x00,  0xfd,  0xf9,  0xf3,  0x09,  0xbc,  0xdc,  0xf8,  0x00,  0x26,  0x2e,  0x34,  0x10,  0x10,  0x00,  0xc8,  0x23,  0x07,  0x0f,  0x0f,  0x0f,  0x0f,  0x0f,  0x3f,  0xdc,  0x66,  0x77,  0x2f,  0x0f,  0x0a,  0x02,  0x12,  0xc0,  0xe0,  0xf1,  0xf3,  0xf7,  0xf0,  0xf0,  0xfc,  0x3e,  0x6b,  0xb0,  0xe9,  0x2f,  0xc2,  0x04,  0x1e,  0x00,  0xdf,  0xdf,  0xcf,  0xd0,  0x3d,  0x3b,  0x1f,  0x00,  0xd2,  0x0c,  0x90,  0xf2,  0x40,  0x20,  0x7c,  0xf8,  0xfe,  0xfa,  0xf6,  0x0a,  0xbc,  0xdc,  0xfc,  0xf8);
}